

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qasm.hpp
# Opt level: O2

__string_type * __thiscall
qclab::qasm2_abi_cxx11_
          (__string_type *__return_storage_ptr__,qclab *this,char *type,int qubit0,int qubit1)

{
  ostream *poVar1;
  stringstream stream;
  stringstream asStack_1a8 [16];
  ostream local_198 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_1a8);
  poVar1 = std::operator<<(local_198,(char *)this);
  poVar1 = std::operator<<(poVar1," q[");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,(int)type);
  poVar1 = std::operator<<(poVar1,"], q[");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,qubit0);
  std::operator<<(poVar1,"];\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1a8);
  return __return_storage_ptr__;
}

Assistant:

inline auto qasm2( const char type[] , const int qubit0 , const int qubit1 ) {
    std::stringstream stream ;
    stream << type << " q[" << qubit0 << "], q[" << qubit1 << "];\n" ;
    return stream.str() ;
  }